

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O0

ostream * fizplex::operator<<(ostream *os,SVector *vec)

{
  bool bVar1;
  const_iterator os_00;
  Nonzero *in_RDI;
  const_iterator it;
  Nonzero *in_stack_ffffffffffffffd8;
  __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_18 [2];
  Nonzero *local_8;
  
  local_8 = in_RDI;
  local_18[0]._M_current = (Nonzero *)SVector::cbegin(in_stack_ffffffffffffffd8);
  while( true ) {
    os_00 = SVector::cend(in_stack_ffffffffffffffd8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                        *)os_00._M_current,
                       (__normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd8 = local_8;
    __gnu_cxx::
    __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
    ::operator*(local_18);
    operator<<((ostream *)os_00._M_current,in_stack_ffffffffffffffd8);
    __gnu_cxx::
    __normal_iterator<const_fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
    ::operator++(local_18);
  }
  return (ostream *)local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &os, SVector const &vec) {
  for (auto it = vec.cbegin(); it != vec.cend(); ++it) {
    os << *it;
  }
  return os;
}